

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::RunCMakeAndTest(cmCTest *this,string *output)

{
  int iVar1;
  cmCTestBuildAndTestHandler *this_00;
  ostream *poVar2;
  ostringstream cmCTestLog_msg;
  char *local_1b8 [4];
  ostringstream local_198 [376];
  
  this->Verbose = true;
  this_00 = (cmCTestBuildAndTestHandler *)GetHandler(this,"buildtest");
  iVar1 = (*(this_00->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])(this_00);
  cmCTestBuildAndTestHandler::GetOutput(this_00);
  std::__cxx11::string::assign((char *)output);
  cmDynamicLoader::FlushCache();
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,"build and test failing returning: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x8d4,local_1b8[0],false);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return iVar1;
}

Assistant:

int cmCTest::RunCMakeAndTest(std::string* output)
{
  this->Verbose = true;
  cmCTestBuildAndTestHandler* handler =
    static_cast<cmCTestBuildAndTestHandler*>(this->GetHandler("buildtest"));
  int retv = handler->ProcessHandler();
  *output = handler->GetOutput();
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
  if (retv != 0) {
    cmCTestLog(this, DEBUG, "build and test failing returning: " << retv
                                                                 << std::endl);
  }
  return retv;
}